

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O1

reference __thiscall
pstore::gsl::details::span_iterator<pstore::gsl::span<pstore::sat_entry,_-1L>,_false>::operator*
          (span_iterator<pstore::gsl::span<pstore::sat_entry,__1L>,_false> *this)

{
  span<pstore::sat_entry,__1L> *psVar1;
  long lVar2;
  
  psVar1 = this->span_;
  if (psVar1 == (span<pstore::sat_entry,__1L> *)0x0) {
    assert_failed("span_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                  ,0x6f);
  }
  lVar2 = this->index_;
  if ((-1 < lVar2) && (lVar2 < (psVar1->storage_).super_extent_type<_1L>.size_)) {
    return (psVar1->storage_).data_ + lVar2;
  }
  assert_failed("idx >= 0 && idx < storage_.size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x18a);
}

Assistant:

reference operator* () const {
                    PSTORE_ASSERT (span_);
                    return (*span_)[index_];
                }